

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::status_internal::StatusRep::SetPayload
          (StatusRep *this,string_view type_url,Cord *payload)

{
  bool bVar1;
  status_internal *this_00;
  type this_01;
  unsigned_long *puVar2;
  reference pVVar3;
  pointer this_02;
  Cord *pCVar4;
  optional<unsigned_long> oVar5;
  string_view type_url_00;
  allocator<char> local_81;
  value_type local_80;
  StatusRep *local_50;
  size_t local_48;
  _Storage<unsigned_long,_true> local_40;
  optional<unsigned_long> index;
  Cord *payload_local;
  StatusRep *this_local;
  string_view type_url_local;
  
  type_url_local._M_len = (size_t)type_url._M_str;
  this_local = (StatusRep *)type_url._M_len;
  pCVar4 = payload;
  bVar1 = std::operator==(&this->payloads_,(nullptr_t)0x0);
  if (bVar1) {
    std::
    make_unique<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,1ul,std::allocator<absl::lts_20250127::status_internal::Payload>>>
              ();
    std::
    unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
    ::operator=(&this->payloads_,
                (unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                 *)&index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._M_engaged);
    std::
    unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
    ::~unique_ptr((unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                   *)&index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged);
  }
  this_00 = (status_internal *)
            std::
            unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
            ::get(&this->payloads_);
  local_50 = this_local;
  local_48 = type_url_local._M_len;
  type_url_00._M_str = (char *)pCVar4;
  type_url_00._M_len = type_url_local._M_len;
  oVar5 = FindPayloadIndexByUrl(this_00,(Payloads *)this_local,type_url_00);
  local_40._M_value =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional<unsigned_long>::has_value((optional<unsigned_long> *)&local_40);
  if (bVar1) {
    this_01 = std::
              unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
              ::operator*(&this->payloads_);
    puVar2 = std::optional<unsigned_long>::value((optional<unsigned_long> *)&local_40);
    pVVar3 = InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
             ::operator[](this_01,*puVar2);
    Cord::operator=(&pVVar3->payload,payload);
  }
  else {
    this_02 = std::
              unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
              ::operator->(&this->payloads_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_80,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               &local_81);
    Cord::Cord(&local_80.payload,payload);
    InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
    ::push_back(this_02,&local_80);
    Payload::~Payload(&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return;
}

Assistant:

void StatusRep::SetPayload(absl::string_view type_url, absl::Cord payload) {
  if (payloads_ == nullptr) {
    payloads_ = absl::make_unique<status_internal::Payloads>();
  }

  absl::optional<size_t> index =
      status_internal::FindPayloadIndexByUrl(payloads_.get(), type_url);
  if (index.has_value()) {
    (*payloads_)[index.value()].payload = std::move(payload);
    return;
  }

  payloads_->push_back({std::string(type_url), std::move(payload)});
}